

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  WalkerManager *this;
  allocator local_221;
  _InputArray local_220;
  vector<rect,_std::allocator<rect>_> rs;
  Mat image;
  MatExpr local_190 [352];
  
  this = (WalkerManager *)operator_new(0x20);
  WalkerManager::WalkerManager(this,3);
  do {
    cv::Mat::zeros((int)local_190,600,600);
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)&image);
    cv::MatExpr::~MatExpr(local_190);
    WalkerManager::UpdateAllWalkers(this);
    WalkerManager::ShowAllWalkers(this,&image);
    WalkerManager::GetRectFromManager
              ((vector<rect,_std::allocator<rect>_> *)
               &rs.super__Vector_base<rect,_std::allocator<rect>_>,this);
    tracker_function((vector<rect,_std::allocator<rect>_> *)
                     &rs.super__Vector_base<rect,_std::allocator<rect>_>,&image);
    std::__cxx11::string::string((string *)local_190,"image ",&local_221);
    local_220.sz.width = 0;
    local_220.sz.height = 0;
    local_220.flags = 0x1010000;
    local_220.obj = (MatExpr *)&image;
    cv::imshow((string *)local_190,&local_220);
    std::__cxx11::string::~string((string *)local_190);
    cv::waitKey(0x32);
    std::_Vector_base<rect,_std::allocator<rect>_>::~_Vector_base
              (&rs.super__Vector_base<rect,_std::allocator<rect>_>);
    cv::Mat::~Mat(&image);
  } while( true );
}

Assistant:

int main()
{
    WalkerManager* manager = new WalkerManager(3);

    for(int i=0; i=100; ++i)
    {
        cv::Mat image = cv::Mat::zeros(600, 600, CV_8UC3);
        manager->UpdateAllWalkers();
        manager->ShowAllWalkers(image);

        std::vector<rect> rs = manager->GetRectFromManager();
        tracker_function(rs, image);

        cv::imshow("image ", image);
        cv::waitKey(50);
    }

    delete manager;
}